

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O2

bool __thiscall Symbol_table::is_declared(Symbol_table *this,string *s)

{
  pointer pVVar1;
  pointer pVVar2;
  __type _Var3;
  pointer __lhs;
  Variable *var;
  
  pVVar1 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pVVar2 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_start;
  do {
    __lhs = pVVar2;
    if (__lhs == pVVar1) break;
    _Var3 = std::operator==(&__lhs->name,s);
    pVVar2 = __lhs + 1;
  } while (!_Var3);
  return __lhs != pVVar1;
}

Assistant:

bool Symbol_table::is_declared(const string& s)
{
	for (auto&& var : var_table)
		if (var.name == s)
			return true;
	return false;
}